

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiTableInstanceData *pIVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  int order_n;
  ulong uVar8;
  int i;
  uint uVar9;
  float fVar10;
  float fVar11;
  bool held;
  bool hovered;
  float local_7c;
  float local_78;
  float local_74;
  ImSpan<ImGuiTableColumn> *local_70;
  ImRect hit_rect;
  
  pIVar3 = GImGui;
  if ((table->Flags & 1) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Resizable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x475,"void ImGui::TableUpdateBorders(ImGuiTable *)");
  }
  pIVar5 = TableGetInstanceData(table,(int)table->InstanceCurrent);
  local_78 = (table->OuterRect).Min.y;
  fVar1 = (table->OuterRect).Max.y;
  fVar11 = pIVar5->LastOuterHeight + local_78;
  uVar9 = -(uint)(fVar11 <= fVar1);
  local_7c = pIVar5->LastFirstRowHeight + local_78;
  local_70 = &table->Columns;
  for (uVar8 = 0; (long)uVar8 < (long)table->ColumnsCount; uVar8 = uVar8 + 1) {
    if ((table->EnabledMaskByDisplayOrder >> (uVar8 & 0x3f) & 1) != 0) {
      pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,(int)uVar8);
      cVar2 = *pcVar6;
      i = (int)cVar2;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[](local_70,i);
      if ((((pIVar7->Flags & 0x40000020U) == 0) &&
          ((fVar10 = (float)(uVar9 & (uint)fVar1 | ~uVar9 & (uint)fVar11),
           (table->Flags & 0x800) == 0 || (fVar10 = local_7c, table->IsUsingHeaders != false)))) &&
         ((pIVar7->IsVisibleX != false || (table->LastResizedColumn == cVar2)))) {
        local_74 = fVar10;
        id = TableGetColumnResizeID(table,i,(int)table->InstanceCurrent);
        hit_rect.Min.x = pIVar7->MaxX + -4.0;
        hit_rect.Max.x = pIVar7->MaxX + 4.0;
        hit_rect.Min.y = local_78;
        hit_rect.Max.y = local_74;
        KeepAliveID(id);
        hovered = false;
        held = false;
        bVar4 = ButtonBehavior(&hit_rect,id,&hovered,&held,0x41910);
        if ((bVar4) && (bVar4 = IsMouseDoubleClicked(0), bVar4)) {
          TableSetColumnWidthAutoSingle(table,i);
          ClearActiveID();
          hovered = false;
          held = false;
        }
        if (held == true) {
          if (table->LastResizedColumn == -1) {
            fVar10 = -3.4028235e+38;
            if (table->RightMostEnabledColumn != -1) {
              pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                                 (local_70,(int)table->RightMostEnabledColumn);
              fVar10 = pIVar7->MaxX;
            }
            table->ResizeLockMinContentsX2 = fVar10;
          }
          table->ResizedColumn = cVar2;
          table->InstanceInteracted = table->InstanceCurrent;
        }
        if (((hovered == true) && (0.06 < pIVar3->HoveredIdTimer)) || (held == true)) {
          table->HoveredColumnBorder = cVar2;
          SetMouseCursor(4);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}